

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O2

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall VariationIndex::_getInsertions(VariationIndex *this,int chromosome_id,size_t position)

{
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
  *this_00;
  long lVar1;
  ulong uVar2;
  pointer __p;
  node_pointer ppVar3;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar4;
  ulong uVar5;
  pointer __p_00;
  ulong in_RCX;
  undefined4 in_register_00000034;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  long lVar6;
  emplace_return eVar7;
  int chromosome_id_local;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_38;
  
  chromosome_id_local = (int)position;
  this_00 = (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
             *)(CONCAT44(in_register_00000034,chromosome_id) + 0x10);
  ppVar3 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>,_int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>_>_>
           ::find_node(this_00,&chromosome_id_local);
  if (ppVar3 == (node_pointer)0x0) {
    this->_vptr_VariationIndex = (_func_int **)0x0;
  }
  else {
    eVar7 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                        *)this_00,&chromosome_id_local);
    iVar4 = eVar7.first.node_;
    uVar5 = (in_RCX - 1) / *(ulong *)(CONCAT44(in_register_00000034,chromosome_id) + 0x78);
    lVar6 = *(long *)((long)&((iVar4.node_)->value_base_).data_.data_ + 0x20);
    lVar1 = *(long *)((long)&((iVar4.node_)->value_base_).data_.data_ + 0x28);
    this->_vptr_VariationIndex = (_func_int **)0x0;
    if (uVar5 < (ulong)(lVar1 - lVar6 >> 5)) {
      uVar5 = *(ulong *)(lVar6 + uVar5 * 0x20);
      lVar6 = uVar5 * 0x18 + 8;
      while( true ) {
        lVar1 = *(long *)((long)&((iVar4.node_)->value_base_).data_.data_ + 8);
        if (((ulong)((*(long *)((long)&((iVar4.node_)->value_base_).data_.data_ + 0x10) - lVar1) /
                    0x18) <= uVar5) || (uVar2 = *(ulong *)(lVar1 + -8 + lVar6), in_RCX < uVar2))
        break;
        if ((uVar2 == in_RCX) && (*(int *)(lVar1 + 8 + lVar6) == 0)) {
          this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    this->_vptr_VariationIndex;
          if (this_01 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
            __p_00 = (pointer)operator_new(0x18);
            (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__p_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_38._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )0x0;
            std::
            __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)this,__p_00);
            std::
            unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)&local_38);
            this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      this->_vptr_VariationIndex;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (this_01,(value_type_conflict3 *)(lVar1 + lVar6));
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      }
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getInsertions(int chromosome_id, size_t position) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (position-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > position) break;
		if ((event.position == position) && (event.type == INSERTION)) {
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
		}
	}
	return result;
}